

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
* __thiscall
kratos::GeneratorGraph::get_leveled_nodes
          (vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
           *__return_storage_ptr__,GeneratorGraph *this)

{
  mapped_type mVar1;
  GeneratorNode *pGVar2;
  Generator *pGVar3;
  size_t sVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  undefined8 *puVar7;
  long *plVar8;
  long *plVar9;
  shared_ptr<kratos::Generator> *child_generator;
  Generator *pGVar10;
  uint uVar11;
  size_type __new_size;
  undefined1 local_100 [8];
  unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
  level_index;
  undefined1 auStack_b8 [8];
  queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
  queue;
  GeneratorNode *local_60;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  local_58;
  GeneratorGraph *local_40;
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  *local_38;
  
  queue.c.
  super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  queue.c.
  super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  queue.c.
  super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  queue.c.
  super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  queue.c.
  super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  queue.c.
  super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  queue.c.
  super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  queue.c.
  super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  queue.c.
  super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::
  _Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
                       *)auStack_b8,0);
  local_100 = (undefined1  [8])&level_index._M_h._M_rehash_policy._M_next_resize;
  level_index._M_h._M_buckets = (__buckets_ptr)0x1;
  level_index._M_h._M_bucket_count = 0;
  level_index._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  level_index._M_h._M_element_count._0_4_ = 0x3f800000;
  level_index._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  level_index._M_h._M_rehash_policy._4_4_ = 0;
  level_index._M_h._M_rehash_policy._M_next_resize = 0;
  local_58.
  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this->root_;
  local_58.
  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_40 = this;
  std::
  deque<std::pair<kratos::Generator*,unsigned_int>,std::allocator<std::pair<kratos::Generator*,unsigned_int>>>
  ::emplace_back<std::pair<kratos::Generator*,unsigned_int>>
            ((deque<std::pair<kratos::Generator*,unsigned_int>,std::allocator<std::pair<kratos::Generator*,unsigned_int>>>
              *)auStack_b8,(pair<kratos::Generator_*,_unsigned_int> *)&local_58);
  if (queue.c.
      super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node ==
      (_Map_pointer)
      queue.c.
      super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    __new_size = 1;
  }
  else {
    uVar11 = 0;
    local_38 = __return_storage_ptr__;
    do {
      sVar4 = queue.c.
              super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size;
      if ((_Elt_pointer)
          queue.c.
          super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
          ._M_impl.super__Deque_impl_data._M_map_size ==
          queue.c.
          super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_first + -1) {
        operator_delete(queue.c.
                        super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur,0x200);
        queue.c.
        super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size =
             *(size_t *)
              &(queue.c.
                super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last)->second;
        queue.c.
        super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first =
             (_Elt_pointer)
             (queue.c.
              super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size + 0x200);
        queue.c.
        super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur =
             (_Elt_pointer)
             queue.c.
             super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
             ._M_impl.super__Deque_impl_data._M_map_size;
        queue.c.
        super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)
             &(queue.c.
               super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last)->second;
      }
      else {
        queue.c.
        super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size =
             queue.c.
             super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
             ._M_impl.super__Deque_impl_data._M_map_size + 0x10;
      }
      local_60 = get_node(local_40,*(Generator **)sVar4);
      uVar6 = (ulong)local_60 % (ulong)level_index._M_h._M_buckets;
      if (*(long **)((long)local_100 + uVar6 * 8) == (long *)0x0) {
LAB_001ab2c4:
        mVar1 = *(mapped_type *)(sVar4 + 8);
        pmVar5 = std::__detail::
                 _Map_base<kratos::GeneratorNode_*,_std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<kratos::GeneratorNode_*,_std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)local_100,&local_60);
        *pmVar5 = mVar1;
      }
      else {
        plVar8 = (long *)**(long **)((long)local_100 + uVar6 * 8);
        pGVar2 = (GeneratorNode *)plVar8[1];
        plVar9 = plVar8;
        if (local_60 != pGVar2) {
          do {
            plVar9 = (long *)*plVar9;
            if ((plVar9 == (long *)0x0) ||
               ((ulong)plVar9[1] % (ulong)level_index._M_h._M_buckets != uVar6)) goto LAB_001ab2c4;
          } while (local_60 != (GeneratorNode *)plVar9[1]);
          while (local_60 != pGVar2) {
            plVar8 = (long *)*plVar8;
            if ((plVar8 == (long *)0x0) ||
               (pGVar2 = (GeneratorNode *)plVar8[1],
               (ulong)pGVar2 % (ulong)level_index._M_h._M_buckets != uVar6)) {
              std::__throw_out_of_range("_Map_base::at");
            }
          }
        }
        if (*(uint *)(plVar8 + 2) < *(uint *)(sVar4 + 8)) goto LAB_001ab2c4;
      }
      Generator::get_child_generators(&local_58,*(Generator **)sVar4);
      pGVar3 = (Generator *)
               CONCAT44(local_58.
                        super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                        (uint)local_58.
                              super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
      for (pGVar10 = (Generator *)
                     local_58.
                     super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pGVar10 != pGVar3;
          pGVar10 = (Generator *)
                    &(pGVar10->super_IRNode).fn_name_ln.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
        level_index._M_h._M_single_bucket = (__node_base_ptr)(pGVar10->super_IRNode)._vptr_IRNode;
        std::
        deque<std::pair<kratos::Generator*,unsigned_int>,std::allocator<std::pair<kratos::Generator*,unsigned_int>>>
        ::emplace_back<std::pair<kratos::Generator*,unsigned_int>>
                  ((deque<std::pair<kratos::Generator*,unsigned_int>,std::allocator<std::pair<kratos::Generator*,unsigned_int>>>
                    *)auStack_b8,
                   (pair<kratos::Generator_*,_unsigned_int> *)&level_index._M_h._M_single_bucket);
      }
      std::
      vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
      ::~vector(&local_58);
      if (uVar11 < *(uint *)(sVar4 + 8)) {
        uVar11 = *(uint *)(sVar4 + 8);
      }
    } while (queue.c.
             super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node !=
             (_Map_pointer)
             queue.c.
             super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
             ._M_impl.super__Deque_impl_data._M_map_size);
    __new_size = (size_type)(uVar11 + 1);
    __return_storage_ptr__ = local_38;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  ::resize(__return_storage_ptr__,__new_size);
  for (puVar7 = (undefined8 *)level_index._M_h._M_bucket_count; puVar7 != (undefined8 *)0x0;
      puVar7 = (undefined8 *)*puVar7) {
    std::vector<kratos::Generator*,std::allocator<kratos::Generator*>>::
    emplace_back<kratos::Generator*&>
              ((vector<kratos::Generator*,std::allocator<kratos::Generator*>> *)
               ((__return_storage_ptr__->
                super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + *(uint *)(puVar7 + 2)),
               (Generator **)(puVar7[1] + 8));
  }
  std::
  _Hashtable<kratos::GeneratorNode_*,_std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::GeneratorNode_*,_std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_100);
  std::
  _Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
  ::~_Deque_base((_Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
                  *)auStack_b8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Generator *>> GeneratorGraph::get_leveled_nodes() {
    // this is a modified breath-first search
    std::queue<std::pair<Generator *, uint32_t>> queue;
    std::unordered_map<GeneratorNode *, uint32_t> level_index;

    queue.push({root_, 0});
    uint32_t max_level = 0;

    while (!queue.empty()) {
        const auto &[generator, current_level] = queue.front();
        queue.pop();
        auto const &node = get_node(generator);
        if (level_index.find(node) == level_index.end() || level_index.at(node) < current_level) {
            // update the new level
            level_index[node] = current_level;
        }
        // loop through all the child generators
        for (const auto &child_generator : generator->get_child_generators()) {
            queue.push({child_generator.get(), current_level + 1});
        }
        if (current_level > max_level) max_level = current_level;
    }

    // construct the result
    std::vector<std::vector<Generator *>> result;
    // notice that max is exclusive
    result.resize(max_level + 1);
    for (auto const &[generator_node, level] : level_index) {
        result[level].emplace_back(generator_node->generator);
    }
    return result;
}